

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv+scc.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  scc_t *scc_00;
  uint8_t *puVar5;
  int iVar6;
  flvtag_avcpackettype_t fVar7;
  FILE *pFVar8;
  utf8_char_t *puVar9;
  FILE *flv;
  size_t sVar10;
  uint uVar11;
  char *pcVar12;
  char *__format;
  double dVar13;
  scc_t *scc;
  int has_video;
  int has_audio;
  utf8_char_t *local_60;
  FILE *local_58;
  utf8_char_t *local_50;
  size_t scc_size;
  flvtag_t tag;
  
  scc = (scc_t *)0x0;
  scc_size = 0;
  if (argc < 4) {
    pcVar12 = *argv;
    __format = "Usage: %s input.flv input.scc output.flv\nuse \'-\' for stdin or stdout\n";
  }
  else {
    pFVar8 = flv_open_read(argv[1]);
    puVar9 = utf8_load_text_file(argv[2],&scc_size);
    flv = flv_open_write(argv[3]);
    local_58 = pFVar8;
    if (pFVar8 == (FILE *)0x0) {
      pcVar12 = argv[1];
      __format = "Falule to open input flv \'%s\'\n";
    }
    else if (puVar9 == (utf8_char_t *)0x0) {
      pcVar12 = argv[2];
      __format = "Falule to open input scc \'%s\'\n";
    }
    else {
      if (flv != (FILE *)0x0) {
        flvtag_init(&tag);
        iVar6 = flv_read_header(local_58,&has_audio,&has_video);
        if (iVar6 == 0) {
          fprintf(_stderr,"%s is not an flv file\n",argv[1]);
          iVar6 = 1;
        }
        else {
          flv_write_header(flv,has_audio,has_video);
          sVar10 = scc_to_608(&scc,puVar9);
          local_60 = puVar9 + sVar10;
          local_50 = puVar9;
          while( true ) {
            iVar6 = flv_read_tag(local_58,&tag);
            puVar5 = tag.data;
            if (iVar6 == 0) break;
            bVar1 = tag.data[7];
            bVar2 = tag.data[4];
            bVar3 = tag.data[5];
            bVar4 = tag.data[6];
            fVar7 = flvtag_avcpackettype(&tag);
            scc_00 = scc;
            uVar11 = 0;
            if (fVar7 == flvtag_avcpackettype_nalu) {
              uVar11 = (uint)puVar5[0xf] | (uint)puVar5[0xe] << 8 | (uint)puVar5[0xd] << 0x10;
            }
            dVar13 = (double)(((uint)bVar3 << 8 | (uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 |
                              (uint)bVar4) + uVar11) / 1000.0;
            if (((scc != (scc_t *)0x0) && (scc->cc_size != 0)) &&
               (scc->timestamp <= dVar13 && dVar13 != scc->timestamp)) {
              fVar7 = flvtag_avcpackettype(&tag);
              if (fVar7 == flvtag_avcpackettype_nalu) {
                flvtag_addcaption_scc(&tag,scc_00);
                puVar9 = local_60;
                sVar10 = scc_to_608(&scc,local_60);
                local_60 = puVar9 + sVar10;
              }
            }
            flv_write_tag(flv,&tag);
          }
          free(local_50);
          flvtag_free(&tag);
          iVar6 = 0;
        }
        return iVar6;
      }
      pcVar12 = argv[3];
      __format = "Falule to open output flv \'%s\'\n";
    }
  }
  fprintf(_stderr,__format,pcVar12);
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    flvtag_t tag;
    scc_t* scc = NULL;
    size_t scc_size = 0;

    if (4 > argc) {
        fprintf(stderr, "Usage: %s input.flv input.scc output.flv\nuse '-' for stdin or stdout\n", argv[0]);
        exit(EXIT_FAILURE);
    }

    FILE* flv = flv_open_read(argv[1]);
    utf8_char_t* scc_data_ptr = utf8_load_text_file(argv[2], &scc_size);
    utf8_char_t* scc_data = scc_data_ptr;
    FILE* out = flv_open_write(argv[3]);

    if (!flv) {
        fprintf(stderr, "Falule to open input flv '%s'\n", argv[1]);
        exit(EXIT_FAILURE);
    }

    if (!scc_data) {
        fprintf(stderr, "Falule to open input scc '%s'\n", argv[2]);
        exit(EXIT_FAILURE);
    }

    if (!out) {
        fprintf(stderr, "Falule to open output flv '%s'\n", argv[3]);
        exit(EXIT_FAILURE);
    }

    int has_audio, has_video;
    flvtag_init(&tag);

    if (!flv_read_header(flv, &has_audio, &has_video)) {
        fprintf(stderr, "%s is not an flv file\n", argv[1]);
        return EXIT_FAILURE;
    }

    flv_write_header(out, has_audio, has_video);

    // read the first scc
    scc_data += scc_to_608(&scc, scc_data);

    while (flv_read_tag(flv, &tag)) {
        double timestamp = flvtag_pts_seconds(&tag);

        if (scc && scc->cc_size && scc->timestamp < timestamp && flvtag_avcpackettype_nalu == flvtag_avcpackettype(&tag)) {
            flvtag_addcaption_scc(&tag, scc);
            scc_data += scc_to_608(&scc, scc_data);
        }

        flv_write_tag(out, &tag);
    }

    free(scc_data_ptr);
    flvtag_free(&tag);
    return EXIT_SUCCESS;
}